

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLNode::ToElementWithName(XMLNode *this,char *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *p;
  XMLElement *element;
  char *name_local;
  XMLNode *this_local;
  
  iVar2 = (*this->_vptr_XMLNode[6])();
  this_local = (XMLNode *)CONCAT44(extraout_var,iVar2);
  if ((XMLElement *)this_local == (XMLElement *)0x0) {
    this_local = (XMLNode *)0x0;
  }
  else if (name != (char *)0x0) {
    p = XMLElement::Name((XMLElement *)this_local);
    bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (!bVar1) {
      this_local = (XMLNode *)0x0;
    }
  }
  return (XMLElement *)this_local;
}

Assistant:

const XMLElement* XMLNode::ToElementWithName( const char* name ) const
{
    const XMLElement* element = this->ToElement();
    if ( element == 0 ) {
        return 0;
    }
    if ( name == 0 ) {
        return element;
    }
    if ( XMLUtil::StringEqual( element->Name(), name ) ) {
       return element;
    }
    return 0;
}